

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ColumnData::ScanVector
          (ColumnData *this,ColumnScanState *state,Vector *result,idx_t remaining,
          ScanVectorType scan_type,idx_t base_result_offset)

{
  optional_ptr<duckdb::TableScanOptions,_true> *this_00;
  idx_t iVar1;
  ColumnSegment *pCVar2;
  CompressionFunction *pCVar3;
  int iVar4;
  InternalException *this_01;
  idx_t iVar5;
  long lVar6;
  idx_t iVar7;
  idx_t iVar8;
  ulong uVar9;
  ColumnFetchState fetch_state;
  undefined1 local_80 [32];
  float local_60;
  size_t local_58;
  __node_base_ptr p_Stack_50;
  vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
  local_48;
  
  if ((scan_type == SCAN_FLAT_VECTOR) && (result->vector_type != FLAT_VECTOR)) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    local_80._0_8_ = local_80 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,
               "ScanVector called with SCAN_FLAT_VECTOR but result is not a flat vector","");
    InternalException::InternalException(this_01,(string *)local_80);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  BeginScanVectorInternal(this,state);
  this_00 = &state->scan_options;
  iVar5 = remaining;
  do {
    if (iVar5 == 0) {
      iVar5 = 0;
      break;
    }
    iVar7 = (state->current->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i +
            (state->current->super_SegmentBase<duckdb::ColumnSegment>).start;
    iVar1 = state->row_index;
    uVar9 = iVar7 - iVar1;
    if (iVar5 < iVar7 - iVar1) {
      uVar9 = iVar5;
    }
    if (iVar7 != iVar1) {
      iVar8 = (base_result_offset + remaining) - iVar5;
      if ((this_00->ptr == (TableScanOptions *)0x0) ||
         (optional_ptr<duckdb::TableScanOptions,_true>::CheckValid(this_00),
         this_00->ptr->force_fetch_row != true)) {
        pCVar2 = state->current;
        pCVar3 = (pCVar2->function)._M_data;
        if (scan_type == SCAN_ENTIRE_VECTOR) {
          (*pCVar3->scan_vector)(pCVar2,state,uVar9,result);
        }
        else {
          (*pCVar3->scan_partial)(pCVar2,state,uVar9,result,iVar8);
        }
      }
      else if (iVar7 != iVar1) {
        lVar6 = 0;
        do {
          local_80._0_8_ = &p_Stack_50;
          local_80._8_8_ = 1;
          local_80._16_8_ = (_Hash_node_base *)0x0;
          local_80._24_8_ = 0;
          local_60 = 1.0;
          local_48.
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_58 = 0;
          p_Stack_50 = (__node_base_ptr)0x0;
          local_48.
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pCVar2 = state->current;
          (*((pCVar2->function)._M_data)->fetch_row)
                    (pCVar2,(ColumnFetchState *)local_80,
                     (state->row_index - (pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start) +
                     lVar6,result,iVar8 + lVar6);
          ::std::
          vector<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnFetchState,_std::default_delete<duckdb::ColumnFetchState>,_true>_>_>
          ::~vector(&local_48);
          ::std::
          _Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_80);
          lVar6 = lVar6 + 1;
        } while (uVar9 + (uVar9 == 0) != lVar6);
      }
      state->row_index = state->row_index + uVar9;
      iVar5 = iVar5 - uVar9;
    }
    if (iVar5 == 0) {
LAB_0060608f:
      iVar4 = 0;
    }
    else {
      pCVar2 = (state->current->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
      if (pCVar2 != (ColumnSegment *)0x0) {
        ::std::
        vector<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>,std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>,std::allocator<duckdb::unique_ptr<duckdb::SegmentScanState,std::default_delete<duckdb::SegmentScanState>,true>>>
                    *)&state->previous_states,&state->scan_state);
        state->current = pCVar2;
        ColumnSegment::InitializeScan(pCVar2,state);
        state->segment_checked = false;
        goto LAB_0060608f;
      }
      iVar4 = 3;
    }
  } while (iVar4 == 0);
  state->internal_index = state->row_index;
  return remaining - iVar5;
}

Assistant:

idx_t ColumnData::ScanVector(ColumnScanState &state, Vector &result, idx_t remaining, ScanVectorType scan_type,
                             idx_t base_result_offset) {
	if (scan_type == ScanVectorType::SCAN_FLAT_VECTOR && result.GetVectorType() != VectorType::FLAT_VECTOR) {
		throw InternalException("ScanVector called with SCAN_FLAT_VECTOR but result is not a flat vector");
	}
	BeginScanVectorInternal(state);
	idx_t initial_remaining = remaining;
	while (remaining > 0) {
		D_ASSERT(state.row_index >= state.current->start &&
		         state.row_index <= state.current->start + state.current->count);
		idx_t scan_count = MinValue<idx_t>(remaining, state.current->start + state.current->count - state.row_index);
		idx_t result_offset = base_result_offset + initial_remaining - remaining;
		if (scan_count > 0) {
			if (state.scan_options && state.scan_options->force_fetch_row) {
				for (idx_t i = 0; i < scan_count; i++) {
					ColumnFetchState fetch_state;
					state.current->FetchRow(fetch_state, UnsafeNumericCast<row_t>(state.row_index + i), result,
					                        result_offset + i);
				}
			} else {
				state.current->Scan(state, scan_count, result, result_offset, scan_type);
			}

			state.row_index += scan_count;
			remaining -= scan_count;
		}

		if (remaining > 0) {
			auto next = data.GetNextSegment(state.current);
			if (!next) {
				break;
			}
			state.previous_states.emplace_back(std::move(state.scan_state));
			state.current = next;
			state.current->InitializeScan(state);
			state.segment_checked = false;
			D_ASSERT(state.row_index >= state.current->start &&
			         state.row_index <= state.current->start + state.current->count);
		}
	}
	state.internal_index = state.row_index;
	return initial_remaining - remaining;
}